

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

void Sbd_ManDeriveMapping_rec(Sbd_Man_t *p,Gia_Man_t *pNew,int iObj)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  long lVar4;
  
  if (iObj != 0) {
    if (pNew->nTravIdsAlloc <= iObj) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (pNew->pTravIds[iObj] != pNew->nTravIds) {
      pNew->pTravIds[iObj] = pNew->nTravIds;
      if ((iObj < 0) || (pNew->nObjs <= iObj)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar3 = (uint)*(undefined8 *)(pNew->pObjs + (uint)iObj);
      if ((~uVar3 & 0x9fffffff) != 0) {
        if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                        ,0x7a2,"void Sbd_ManDeriveMapping_rec(Sbd_Man_t *, Gia_Man_t *, int)");
        }
        uVar3 = (p->pPars->nLutSize + 1) * iObj;
        if ((-1 < (int)uVar3) && ((int)uVar3 < p->vLutCuts2->nSize)) {
          piVar2 = p->vLutCuts2->pArray;
          piVar1 = piVar2 + uVar3;
          if (0 < *piVar1) {
            lVar4 = 0;
            do {
              Sbd_ManDeriveMapping_rec(p,pNew,piVar2[(ulong)uVar3 + lVar4 + 1]);
              lVar4 = lVar4 + 1;
            } while (lVar4 < *piVar1);
          }
          p_00 = pNew->vMapping;
          if (iObj < p_00->nSize) {
            p_00->pArray[(uint)iObj] = p_00->nSize;
            if (-1 < *piVar1) {
              lVar4 = -1;
              do {
                Vec_IntPush(pNew->vMapping,piVar1[lVar4 + 1]);
                lVar4 = lVar4 + 1;
              } while (lVar4 < *piVar1);
              p_00 = pNew->vMapping;
            }
            Vec_IntPush(p_00,iObj);
            return;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
    }
  }
  return;
}

Assistant:

void Sbd_ManDeriveMapping_rec( Sbd_Man_t * p, Gia_Man_t * pNew, int iObj )
{
    Gia_Obj_t * pObj; int k, * pCut;
    if ( !iObj || Gia_ObjIsTravIdCurrentId(pNew, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(pNew, iObj);
    pObj = Gia_ManObj( pNew, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pCut = Sbd_ObjCut2( p, iObj );
    for ( k = 1; k <= pCut[0]; k++ )
        Sbd_ManDeriveMapping_rec( p, pNew, pCut[k] );
    // add mapping
    Vec_IntWriteEntry( pNew->vMapping, iObj, Vec_IntSize(pNew->vMapping) );
    for ( k = 0; k <= pCut[0]; k++ )
        Vec_IntPush( pNew->vMapping, pCut[k] );
    Vec_IntPush( pNew->vMapping, iObj );
}